

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_FieldDefaultValueError_Test::
~ParserValidationErrorTest_FieldDefaultValueError_Test
          (ParserValidationErrorTest_FieldDefaultValueError_Test *this)

{
  ParserValidationErrorTest_FieldDefaultValueError_Test *this_local;
  
  ParserTest::~ParserTest(&this->super_ParserValidationErrorTest);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, FieldDefaultValueError) {
  ExpectHasValidationErrors(
      "enum Baz { QUX = 1; }\n"
      "message Foo {\n"
      "  optional Baz bar = 1 [default=NO_SUCH_VALUE];\n"
      "}\n",
      "2:32: Enum type \"Baz\" has no value named \"NO_SUCH_VALUE\".\n");
}